

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

int fiobj_data_save_slice(FIOBJ o,char *filename)

{
  int *piVar1;
  ulong uVar2;
  ssize_t act2;
  size_t local_58;
  char *local_50;
  long local_48;
  size_t total;
  fio_str_info_s tmp;
  int target;
  char *filename_local;
  FIOBJ o_local;
  
  tmp.data._4_4_ = open(filename,0x242,0x1ff);
  if (tmp.data._4_4_ == -1) {
    o_local._4_4_ = -1;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_48 = 0;
    do {
      fiobj_data_pread((fio_str_info_s *)&act2,*(FIOBJ *)(o + 0x10),*(long *)(o + 0x18) + local_48,
                       0x1000);
      total = act2;
      tmp.capa = local_58;
      tmp.len = (size_t)local_50;
      if (local_58 == 0) break;
      if (*(ulong *)(o + 0x20) < local_48 + local_58) {
        tmp.capa = *(long *)(o + 0x20) - local_48;
      }
      if (tmp.capa != 0) {
        uVar2 = write(tmp.data._4_4_,local_50,tmp.capa);
        if (((long)uVar2 < 0) || (uVar2 < tmp.capa)) {
          close(tmp.data._4_4_);
          unlink(filename);
          return -1;
        }
        local_48 = uVar2 + local_48;
      }
    } while (tmp.capa == 0x1000);
    close(tmp.data._4_4_);
    o_local._4_4_ = 0;
  }
  return o_local._4_4_;
}

Assistant:

static int fiobj_data_save_slice(FIOBJ o, const char *filename) {
  int target = open(filename, O_RDWR | O_CREAT | O_TRUNC, 0777);
  if (target == -1)
    return -1;
  errno = 0;
  fio_str_info_s tmp;
  size_t total = 0;
  do {
    tmp = fiobj_data_pread(obj2io(o)->source.parent, obj2io(o)->capa + total,
                           4096);
    if (tmp.len == 0)
      break;
    if (total + tmp.len > obj2io(o)->len)
      tmp.len = obj2io(o)->len - total;
    if (tmp.len) {
      ssize_t act2 = write(target, tmp.data, tmp.len);
      if (act2 < 0 || (size_t)act2 < tmp.len)
        goto error;
      total += act2;
    }
  } while (tmp.len == 4096);
  close(target);
  return 0;
error:
  close(target);
  unlink(filename);
  return -1;
}